

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_a_scalar
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  GLint GVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = configuration->m_n_attributes_per_group;
  iVar2 = configuration->m_vertex_length;
  GVar4 = calculateAttributeGroupOffset(this,configuration,n_type);
  uVar5 = GVar4 + iVar2 * vertex;
  uVar6 = uVar1 * n_type + vertex * 2;
  pdVar3 = (out_buffer_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    pdVar3[uVar5] = (double)uVar6;
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void LimitTest::setAttributes_a_scalar(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
									   std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Double attributes should be assigned the value:
	 (n_attribute + gl_VertexID * 2) */

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = attribute + group_offset;

		out_buffer_data[attribute_offset] = attribute + attribute_index + vertex * 2;
	}
}